

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUse
          (DefUseManager *this,Instruction *def,
          function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *f)

{
  uint **ppuVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  const_iterator cVar6;
  Operand *pOVar7;
  byte bVar8;
  uint **ppuVar9;
  uint32_t idx;
  
  if (def != (Instruction *)0x0) {
    bVar8 = def->has_result_id_;
    if ((bool)bVar8 == true) {
      uVar3 = Instruction::result_id(def);
      pIVar5 = GetDef(this,uVar3);
      if (pIVar5 != def) goto LAB_004dc31f;
      bVar8 = def->has_result_id_;
    }
    if ((bVar8 & 1) != 0) {
      for (cVar6 = UsersBegin(this,def);
          ((_Rb_tree_header *)cVar6._M_node !=
           &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header &&
          (*(Instruction **)(cVar6._M_node + 1) == def));
          cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node)) {
        pIVar5 = (Instruction *)cVar6._M_node[1]._M_parent;
        for (uVar3 = 0;
            uVar3 != (uint32_t)
                     (((long)(pIVar5->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pIVar5->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar3 = uVar3 + 1) {
          pOVar7 = Instruction::GetOperand(pIVar5,uVar3);
          if ((pOVar7->type != SPV_OPERAND_TYPE_RESULT_ID) &&
             (bVar2 = spvIsIdType(pOVar7->type), bVar2)) {
            uVar4 = Instruction::result_id(def);
            ppuVar1 = (uint **)(pOVar7->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar9 = &(pOVar7->words).small_data_;
            if (ppuVar1 != (uint **)0x0) {
              ppuVar9 = ppuVar1;
            }
            if ((uVar4 == **ppuVar9) &&
               (bVar2 = std::function<bool_(spvtools::opt::Instruction_*,_unsigned_int)>::operator()
                                  (f,pIVar5,uVar3), !bVar2)) {
              return false;
            }
          }
        }
      }
    }
    return true;
  }
LAB_004dc31f:
  __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                ,0x97,
                "bool spvtools::opt::analysis::DefUseManager::WhileEachUse(const Instruction *, const std::function<bool (Instruction *, uint32_t)> &) const"
               );
}

Assistant:

bool DefUseManager::WhileEachUse(
    const Instruction* def,
    const std::function<bool(Instruction*, uint32_t)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    Instruction* user = iter->user;
    for (uint32_t idx = 0; idx != user->NumOperands(); ++idx) {
      const Operand& op = user->GetOperand(idx);
      if (op.type != SPV_OPERAND_TYPE_RESULT_ID && spvIsIdType(op.type)) {
        if (def->result_id() == op.words[0]) {
          if (!f(user, idx)) return false;
        }
      }
    }
  }
  return true;
}